

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  Index IVar4;
  int iVar5;
  Index extraout_RDX;
  Index extraout_RDX_00;
  array<unsigned_int,_3UL> *this_00;
  Matrix<double,_1,__1,_1,_1,__1> MVar6;
  Type local_288;
  undefined1 local_250 [8];
  Matrix<double,_1,__1,_1,_1,__1> boundary_face_dofs;
  Type local_208;
  Product<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
  local_1d0;
  undefined1 local_160 [8];
  Matrix<double,_1,__1,_1,_1,__1> boundary_function;
  undefined1 local_138 [8];
  Matrix<double,__1,__1,_0,__1,__1> basis_functions;
  undefined1 local_e8 [16];
  Type local_d8;
  undefined1 local_a0 [16];
  Type local_90;
  undefined1 local_48 [36];
  value_type_conflict3 d2;
  value_type_conflict3 d1;
  value_type_conflict3 d0;
  Matrix<double,_1,__1,_1,_1,__1> *nodevals_local;
  FeHierarchicTria<double> *this_local;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  
  this_00 = (array<unsigned_int,_3UL> *)
            ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                    m_storage.m_cols + 4);
  nodevals_local = nodevals;
  this_local = this;
  pvVar3 = std::array<unsigned_int,_3UL>::operator[](this_00,0);
  d2 = *pvVar3 - 1;
  pvVar3 = std::array<unsigned_int,_3UL>::operator[](this_00,1);
  local_48._32_4_ = *pvVar3 - 1;
  pvVar3 = std::array<unsigned_int,_3UL>::operator[](this_00,2);
  local_48._28_4_ = *pvVar3 - 1;
  local_48[0x1b] = 0;
  local_48._20_4_ = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<unsigned_int>
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,(uint *)(local_48 + 0x14));
  NodalValuesToVertexDofs((FeHierarchicTria<double> *)local_48,nodevals);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<int>
            (&local_90,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,0,3);
  Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false> *)&local_90,
             (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_48);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_48);
  NodalValuesToEdgeDofs((FeHierarchicTria<double> *)local_a0,nodevals);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
            (&local_d8,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,3,
             d2 + local_48._32_4_ + local_48._28_4_);
  Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false> *)&local_d8,
             (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_a0);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_a0);
  NodalValuesToFaceDofs((FeHierarchicTria<double> *)local_e8,nodevals);
  iVar5 = d2 + local_48._32_4_;
  iVar1 = local_48._28_4_ + 3;
  sVar2 = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals,0);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
            ((Type *)&basis_functions.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,
             (ulong)(uint)(iVar1 + iVar5),sVar2);
  Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false> *)
             &basis_functions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_e8);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_e8);
  EvaluationNodes((MatrixXd *)
                  &boundary_function.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_cols,(FeHierarchicTria<double> *)nodevals);
  EvalReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_138,(FeHierarchicTria<double> *)nodevals,
             (MatrixXd *)
             &boundary_function.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
              m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &boundary_function.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
              m_storage.m_cols);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
            (&local_208,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,0,
             local_48._28_4_ + 3 + d2 + local_48._32_4_);
  iVar5 = d2 + local_48._32_4_;
  iVar1 = local_48._28_4_ + 3;
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_138);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,long>
            ((Type *)&boundary_face_dofs.
                      super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_138,0,0,
             iVar1 + iVar5,IVar4);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>>::operator*
            (&local_1d0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>> *)&local_208,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
              *)&boundary_face_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                 m_storage.m_cols);
  Eigen::Matrix<double,1,-1,1,1,-1>::
  Matrix<Eigen::Product<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>,0>>
            ((Matrix<double,1,_1,1,1,_1> *)local_160,
             (EigenBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
              *)&local_1d0);
  NodalValuesToFaceDofs((FeHierarchicTria<double> *)local_250,nodevals);
  iVar5 = d2 + local_48._32_4_;
  iVar1 = local_48._28_4_ + 3;
  sVar2 = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals,0);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
            (&local_288,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,
             (ulong)(uint)(iVar1 + iVar5),sVar2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>> *)&local_288,
             (MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_250);
  local_48[0x1b] = 1;
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_250);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_160);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_138);
  IVar4 = extraout_RDX;
  if ((local_48[0x1b] & 1) == 0) {
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)this);
    IVar4 = extraout_RDX_00;
  }
  MVar6.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = IVar4;
  MVar6.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar6.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const override {
    const auto d0 = edge_degrees_[0] - 1;
    const auto d1 = edge_degrees_[1] - 1;
    const auto d2 = edge_degrees_[2] - 1;

    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions());
    // Compute the basis function coefficients of the vertex basis functions
    dofs.segment(0, 3) = NodalValuesToVertexDofs(nodevals);
    // Compute the basis function coefficients on the edges
    dofs.segment(3, d0 + d1 + d2) = NodalValuesToEdgeDofs(nodevals);
    // Compute the basis function coefficients for the face bubbles
    dofs.segment(3 + d0 + d1 + d2, NumRefShapeFunctions(0)) =
        NodalValuesToFaceDofs(nodevals);
    // We need to orthogonalize the face bubble dual basis w.r.t. the
    // dual basis on the vertices and edges
    const Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
        basis_functions = EvalReferenceShapeFunctions(EvaluationNodes());
    const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> boundary_function =
        dofs.segment(0, 3 + d0 + d1 + d2) *
        basis_functions.block(0, 0, 3 + d0 + d1 + d2, basis_functions.cols());
    const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> boundary_face_dofs =
        NodalValuesToFaceDofs(boundary_function);
    dofs.segment(3 + d0 + d1 + d2, NumRefShapeFunctions(0)) -=
        boundary_face_dofs;
    return dofs;
  }